

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.h
# Opt level: O2

void __thiscall btRotationalLimitMotor::btRotationalLimitMotor(btRotationalLimitMotor *this)

{
  this->m_loLimit = 1.0;
  this->m_hiLimit = -1.0;
  this->m_targetVelocity = 0.0;
  this->m_maxMotorForce = 0.1;
  this->m_stopERP = 0.2;
  this->m_stopCFM = 0.0;
  this->m_bounce = 0.0;
  this->m_maxLimitForce = 300.0;
  this->m_damping = 1.0;
  this->m_limitSoftness = 0.5;
  this->m_normalCFM = 0.0;
  this->m_currentLimit = 0;
  this->m_accumulatedImpulse = 0.0;
  this->m_currentLimitError = 0.0;
  this->m_enableMotor = false;
  return;
}

Assistant:

btRotationalLimitMotor()
    {
    	m_accumulatedImpulse = 0.f;
        m_targetVelocity = 0;
        m_maxMotorForce = 0.1f;
        m_maxLimitForce = 300.0f;
        m_loLimit = 1.0f;
        m_hiLimit = -1.0f;
		m_normalCFM = 0.f;
		m_stopERP = 0.2f;
		m_stopCFM = 0.f;
        m_bounce = 0.0f;
        m_damping = 1.0f;
        m_limitSoftness = 0.5f;
        m_currentLimit = 0;
        m_currentLimitError = 0;
        m_enableMotor = false;
    }